

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseCatalogPI(xmlParserCtxtPtr ctxt,xmlChar *catalog)

{
  xmlChar xVar1;
  int iVar2;
  xmlChar *pxVar3;
  void *pvVar4;
  bool bVar5;
  xmlChar marker;
  xmlChar *base;
  xmlChar *tmp;
  xmlChar *URL;
  xmlChar *catalog_local;
  xmlParserCtxtPtr ctxt_local;
  
  tmp = (xmlChar *)0x0;
  base = catalog;
  while( true ) {
    bVar5 = true;
    if ((*base != ' ') && ((*base < 9 || (bVar5 = true, 10 < *base)))) {
      bVar5 = *base == '\r';
    }
    if (!bVar5) break;
    base = base + 1;
  }
  iVar2 = xmlStrncmp(base,"catalog",7);
  if (iVar2 == 0) {
    base = base + 7;
    while( true ) {
      bVar5 = true;
      if ((*base != ' ') && ((*base < 9 || (bVar5 = true, 10 < *base)))) {
        bVar5 = *base == '\r';
      }
      if (!bVar5) break;
      base = base + 1;
    }
    if (*base != '=') {
      return;
    }
    do {
      pxVar3 = base;
      base = pxVar3 + 1;
      bVar5 = true;
      if ((*base != ' ') && ((*base < 9 || (bVar5 = true, 10 < *base)))) {
        bVar5 = *base == '\r';
      }
    } while (bVar5);
    xVar1 = *base;
    if ((xVar1 == '\'') || (xVar1 == '\"')) {
      pxVar3 = pxVar3 + 2;
      base = pxVar3;
      while( true ) {
        bVar5 = false;
        if (*base != '\0') {
          bVar5 = *base != xVar1;
        }
        if (!bVar5) break;
        base = base + 1;
      }
      if (*base != '\0') {
        tmp = xmlStrndup(pxVar3,(int)base - (int)pxVar3);
        do {
          base = base + 1;
          bVar5 = true;
          if ((*base != ' ') && ((*base < 9 || (bVar5 = true, 10 < *base)))) {
            bVar5 = *base == '\r';
          }
        } while (bVar5);
        if (*base == '\0') {
          if (tmp == (xmlChar *)0x0) {
            return;
          }
          pvVar4 = xmlCatalogAddLocal(ctxt->catalogs,tmp);
          ctxt->catalogs = pvVar4;
          (*xmlFree)(tmp);
          return;
        }
      }
    }
  }
  xmlWarningMsg(ctxt,XML_WAR_CATALOG_PI,"Catalog PI syntax error: %s\n",catalog,(xmlChar *)0x0);
  if (tmp != (xmlChar *)0x0) {
    (*xmlFree)(tmp);
  }
  return;
}

Assistant:

static void
xmlParseCatalogPI(xmlParserCtxtPtr ctxt, const xmlChar *catalog) {
    xmlChar *URL = NULL;
    const xmlChar *tmp, *base;
    xmlChar marker;

    tmp = catalog;
    while (IS_BLANK_CH(*tmp)) tmp++;
    if (xmlStrncmp(tmp, BAD_CAST"catalog", 7))
	goto error;
    tmp += 7;
    while (IS_BLANK_CH(*tmp)) tmp++;
    if (*tmp != '=') {
	return;
    }
    tmp++;
    while (IS_BLANK_CH(*tmp)) tmp++;
    marker = *tmp;
    if ((marker != '\'') && (marker != '"'))
	goto error;
    tmp++;
    base = tmp;
    while ((*tmp != 0) && (*tmp != marker)) tmp++;
    if (*tmp == 0)
	goto error;
    URL = xmlStrndup(base, tmp - base);
    tmp++;
    while (IS_BLANK_CH(*tmp)) tmp++;
    if (*tmp != 0)
	goto error;

    if (URL != NULL) {
        /*
         * Unfortunately, the catalog API doesn't report OOM errors.
         * xmlGetLastError isn't very helpful since we don't know
         * where the last error came from. We'd have to reset it
         * before this call and restore it afterwards.
         */
	ctxt->catalogs = xmlCatalogAddLocal(ctxt->catalogs, URL);
	xmlFree(URL);
    }
    return;

error:
    xmlWarningMsg(ctxt, XML_WAR_CATALOG_PI,
	          "Catalog PI syntax error: %s\n",
		  catalog, NULL);
    if (URL != NULL)
	xmlFree(URL);
}